

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O3

void __thiscall
SerialExecutionQueue::addJob(SerialExecutionQueue *this,QueueJob *job,QueueJobPriority param_2)

{
  SerialQueueImpl *this_00;
  JobDescriptor *pJVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  uint64_t uVar4;
  _Any_data local_70;
  _Manager_type local_60;
  _Invoker_type p_Stack_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = this->queue;
  uVar4 = this->jobCount + 1;
  this->jobCount = uVar4;
  pJVar1 = job->desc;
  local_70._M_unused._M_object = (void *)0x0;
  local_70._8_8_ = 0;
  local_60 = (_Manager_type)0x0;
  p_Stack_58 = (_Invoker_type)0x0;
  p_Var2 = (job->work).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_70,(_Any_data *)&job->work,__clone_functor);
    p_Stack_58 = (job->work)._M_invoker;
    local_60 = (job->work).super__Function_base._M_manager;
  }
  p_Var3 = p_Stack_58;
  p_Var2 = local_60;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x30);
  *(uint64_t *)local_50._M_unused._0_8_ = uVar4;
  *(JobDescriptor **)((long)local_50._M_unused._0_8_ + 8) = pJVar1;
  *(uint64_t *)((long)local_50._M_unused._0_8_ + 0x10) = 0;
  *(uint64_t *)((long)local_50._M_unused._0_8_ + 0x18) = 0;
  *(uint64_t *)((long)local_50._M_unused._0_8_ + 0x20) = 0;
  *(_Invoker_type *)((long)local_50._M_unused._0_8_ + 0x28) = p_Var3;
  if (p_Var2 != (_Manager_type)0x0) {
    *(void **)((long)local_50._M_unused._0_8_ + 0x10) = local_70._M_unused._M_object;
    *(undefined8 *)((long)local_50._M_unused._0_8_ + 0x18) = local_70._8_8_;
    *(_Manager_type *)((long)local_50._M_unused._0_8_ + 0x20) = p_Var2;
    local_60 = (_Manager_type)0x0;
    p_Stack_58 = (_Invoker_type)0x0;
  }
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:232:18)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:232:18)>
             ::_M_manager;
  anon_unknown.dwarf_248a18::SerialQueueImpl::async(this_00,(function<void_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_60 != (_Manager_type)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  return;
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority) override {
    uint64_t jobID = ++jobCount;
    queue->async([jobID, job]() mutable {
      SerialContext ctx(jobID, job);
      job.execute(&ctx);
    });
  }